

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.h
# Opt level: O2

Relations dg::vr::RelationsAnalyzer::getCommonByPointedTo<llvm::Value_const*>
                    (VectorSet<const_llvm::Value_*> *froms,
                    vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
                    *changeLocations,Value **val,Relations rels)

{
  pointer ppVVar1;
  HandlePtr pBVar2;
  Relations RVar3;
  ulong uVar4;
  ValueRelations *toRels;
  
  uVar4 = 1;
  while( true ) {
    ppVVar1 = (changeLocations->
              super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(changeLocations->
                      super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar1 >> 3) <= uVar4) {
      return (Relations)(_WordT)rels.bits.super__Base_bitset<1UL>._M_w;
    }
    toRels = &ppVVar1[uVar4]->relations;
    pBVar2 = getCorrespondingByContent(toRels,froms);
    if (pBVar2 == (HandlePtr)0x0) break;
    RVar3 = ValueRelations::between<dg::vr::Bucket,llvm::Value_const*>
                      (toRels,((pBVar2->relatedBuckets)._M_elems[10].vec.
                               super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_data,val);
    uVar4 = (ulong)((int)uVar4 + 1);
    rels.bits.super__Base_bitset<1UL>._M_w =
         (bitset<12UL>)
         ((ulong)rels.bits.super__Base_bitset<1UL>._M_w &
         (ulong)RVar3.bits.super__Base_bitset<1UL>._M_w);
    if (rels.bits.super__Base_bitset<1UL>._M_w == (_Base_bitset<1UL>)0x0) {
      return (Relations)0;
    }
  }
  return (bitset<12UL>)(_Base_bitset<1UL>)0x0;
}

Assistant:

static Relations
    getCommonByPointedTo(const VectorSet<V> &froms,
                         const std::vector<const VRLocation *> &changeLocations,
                         const X &val, Relations rels) {
        for (unsigned i = 1; i < changeLocations.size(); ++i) {
            const ValueRelations &graph = changeLocations[i]->relations;
            HandlePtr from = getCorrespondingByContent(graph, froms);
            if (!from)
                return Relations();
            assert(graph.hasLoad(*from));
            Handle loaded = graph.getPointedTo(*from);

            rels &= graph.between(loaded, val);
            if (!rels.any())
                break;
        }
        return rels;
    }